

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserEvent.h
# Opt level: O2

void __thiscall
UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UserEvent(UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *ev)

{
  Event::Event(&this->super_Event,(ev->super_Event).type);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR__UserEvent_00109b58;
  std::__cxx11::string::string((string *)&this->object,(string *)&ev->object);
  return;
}

Assistant:

UserEvent(const UserEvent<T> &ev) :
            Event(ev.type), object(ev.object) {}